

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<function_element_token> *
read_function_element
          (optional<function_element_token> *__return_storage_ptr__,string_view buf_1,
          string_view buf_2,string_view buf_3)

{
  double dVar1;
  string_view name_;
  string_view buf;
  string_view str;
  string_view str_00;
  bool bVar2;
  real_token *prVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  string_view local_128;
  function_element_token local_118;
  size_t local_f8;
  char *local_f0;
  function_element_token local_e8;
  size_t local_c0;
  size_t local_b8;
  undefined1 local_b0 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt;
  undefined1 local_78 [8];
  string_view to_read;
  undefined1 local_40 [8];
  optional<real_token> value_opt;
  string_view buf_2_local;
  string_view buf_1_local;
  
  value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
  super__Optional_payload_base<real_token>._16_8_ = buf_2._M_len;
  read_real((optional<real_token> *)local_40,buf_1,buf_2);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
    prVar3 = std::optional<real_token>::operator->((optional<real_token> *)local_40);
    local_78 = (undefined1  [8])buf_1._M_len;
    to_read._M_len = (size_t)buf_1._M_str;
    if (prVar3->read != 0) {
      if (prVar3->read == 1) {
        local_78 = (undefined1  [8])
                   value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
                   super__Optional_payload_base<real_token>._16_8_;
        to_read._M_len = (size_t)buf_2._M_str;
      }
      else {
        local_78 = (undefined1  [8])buf_3._M_len;
        to_read._M_len = (size_t)buf_3._M_str;
      }
    }
    str_00._M_str = (char *)to_read._M_len;
    str_00._M_len = (size_t)local_78;
    bVar2 = is_keyword(str_00);
    if (!bVar2) {
      name_opt.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           local_78;
      str._M_str = (char *)to_read._M_len;
      str._M_len = (size_t)local_78;
      bVar2 = starts_with_name(str);
      if (bVar2) {
        local_c0 = (size_t)local_78;
        local_b8 = to_read._M_len;
        buf._M_str = (char *)to_read._M_len;
        buf._M_len = (size_t)local_78;
        read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_b0,buf);
        bVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                          ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           local_b0);
        if (!bVar2) {
          std::optional<function_element_token>::optional(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        prVar3 = std::optional<real_token>::operator->((optional<real_token> *)local_40);
        dVar1 = prVar3->value;
        pbVar4 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                           ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_b0);
        local_f8 = pbVar4->_M_len;
        local_f0 = pbVar4->_M_str;
        prVar3 = std::optional<real_token>::operator->((optional<real_token> *)local_40);
        name_._M_str = local_f0;
        name_._M_len = local_f8;
        function_element_token::function_element_token(&local_e8,dVar1,name_,prVar3->read + 1);
        std::optional<function_element_token>::optional<function_element_token,_true>
                  (__return_storage_ptr__,&local_e8);
        return __return_storage_ptr__;
      }
    }
    prVar3 = std::optional<real_token>::operator->((optional<real_token> *)local_40);
    dVar1 = prVar3->value;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128);
    prVar3 = std::optional<real_token>::operator->((optional<real_token> *)local_40);
    function_element_token::function_element_token(&local_118,dVar1,local_128,prVar3->read);
    std::optional<function_element_token>::optional<function_element_token,_true>
              (__return_storage_ptr__,&local_118);
  }
  else {
    std::optional<function_element_token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<function_element_token>
read_function_element(const std::string_view buf_1,
                      const std::string_view buf_2,
                      const std::string_view buf_3) noexcept
{
    auto value_opt = read_real(buf_1, buf_2);
    if (!value_opt)
        return std::nullopt;

    std::string_view to_read;

    switch (value_opt->read) {
    case 0:
        to_read = buf_1;
        break;
    case 1:
        to_read = buf_2;
        break;
    default:
        to_read = buf_3;
        break;
    }

    if (!is_keyword(to_read) && starts_with_name(to_read)) {
        auto name_opt = read_name(to_read);
        if (!name_opt.has_value())
            return std::nullopt;

        return function_element_token(
          value_opt->value, *name_opt, value_opt->read + 1);
    } else {
        return function_element_token(
          value_opt->value, std::string_view(), value_opt->read);
    }
}